

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O0

int decode_hex(BIGNUM *bn,char *in,int in_len)

{
  int iVar1;
  byte local_3d;
  int local_3c;
  uint8_t hex;
  ulong uStack_38;
  int j;
  BN_ULONG word;
  int local_28;
  int todo;
  int i;
  int in_len_local;
  char *in_local;
  BIGNUM *bn_local;
  
  todo = in_len;
  _i = in;
  in_local = (char *)bn;
  if (in_len < 0x20000000) {
    iVar1 = bn_expand(bn,(long)(in_len << 2));
    if (iVar1 == 0) {
      bn_local._4_4_ = 0;
    }
    else {
      local_28 = 0;
      for (; 0 < todo; todo = todo - word._4_4_) {
        word._4_4_ = 0x10;
        if (todo < 0x10) {
          word._4_4_ = todo;
        }
        uStack_38 = 0;
        for (local_3c = word._4_4_; 0 < local_3c; local_3c = local_3c + -1) {
          local_3d = 0;
          iVar1 = OPENSSL_fromxdigit(&local_3d,(int)_i[todo - local_3c]);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/convert.cc"
                          ,99,"int decode_hex(BIGNUM *, const char *, int)");
          }
          uStack_38 = uStack_38 << 4 | (ulong)local_3d;
        }
        *(ulong *)(*(long *)in_local + (long)local_28 * 8) = uStack_38;
        local_28 = local_28 + 1;
      }
      if (*(int *)(in_local + 0xc) < local_28) {
        __assert_fail("i <= bn->dmax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/convert.cc"
                      ,0x6b,"int decode_hex(BIGNUM *, const char *, int)");
      }
      *(int *)(in_local + 8) = local_28;
      bn_local._4_4_ = 1;
    }
  }
  else {
    ERR_put_error(3,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/convert.cc"
                  ,0x4d);
    bn_local._4_4_ = 0;
  }
  return bn_local._4_4_;
}

Assistant:

static int decode_hex(BIGNUM *bn, const char *in, int in_len) {
  if (in_len > INT_MAX / 4) {
    OPENSSL_PUT_ERROR(BN, BN_R_BIGNUM_TOO_LONG);
    return 0;
  }
  // |in_len| is the number of hex digits.
  if (!bn_expand(bn, in_len * 4)) {
    return 0;
  }

  int i = 0;
  while (in_len > 0) {
    // Decode one |BN_ULONG| at a time.
    int todo = BN_BYTES * 2;
    if (todo > in_len) {
      todo = in_len;
    }

    BN_ULONG word = 0;
    int j;
    for (j = todo; j > 0; j--) {
      uint8_t hex = 0;
      if (!OPENSSL_fromxdigit(&hex, in[in_len - j])) {
        // This shouldn't happen. The caller checks |OPENSSL_isxdigit|.
        assert(0);
      }
      word = (word << 4) | hex;
    }

    bn->d[i++] = word;
    in_len -= todo;
  }
  assert(i <= bn->dmax);
  bn->width = i;
  return 1;
}